

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *type,Reader *replacement,
          UpgradeToStructMode upgradeToStructMode)

{
  short sVar1;
  ushort uVar2;
  uint uVar3;
  short *psVar4;
  bool bVar5;
  uint uVar6;
  long lVar7;
  Maybe<capnp::schema::Node::Reader> *matchSize;
  uint64_t structTypeId;
  long lVar8;
  int iVar9;
  Maybe<capnp::schema::Field::Reader> *matchPosition;
  WirePointer *pWVar10;
  StructDataBitCount *pSVar11;
  Fault f;
  StructReader local_188;
  StructReader local_158;
  PointerReader local_128;
  Maybe<capnp::schema::Field::Reader> local_108;
  Maybe<capnp::schema::Node::Reader> local_d0;
  Maybe<capnp::schema::Field::Reader> local_98;
  Maybe<capnp::schema::Node::Reader> local_60;
  
  uVar3 = (replacement->_reader).dataSize;
  if (uVar3 < 0x10) {
    if ((type->_reader).dataSize < 0x10) {
      return;
    }
    if (*(type->_reader).data == 0) {
      return;
    }
LAB_001df949:
    if ((*(type->_reader).data == 0xd) && (bVar5 = canUpgradeToData(this,replacement), bVar5))
    goto LAB_001df962;
  }
  else {
    sVar1 = *(replacement->_reader).data;
    uVar6 = (type->_reader).dataSize;
    if (uVar6 < 0x10) {
      if (sVar1 == 0) {
        return;
      }
    }
    else {
      psVar4 = (short *)(type->_reader).data;
      if (sVar1 == *psVar4) {
        switch(sVar1) {
        case 0xe:
          pWVar10 = (WirePointer *)0x0;
          bVar5 = (type->_reader).pointerCount == 0;
          local_188.data = (type->_reader).pointers;
          if (bVar5) {
            local_188.data = pWVar10;
          }
          iVar9 = 0x7fffffff;
          local_188.pointers._0_4_ = (type->_reader).nestingLimit;
          if (bVar5) {
            local_188.pointers._0_4_ = 0x7fffffff;
          }
          local_188.segment._0_4_ = 0;
          local_188.segment._4_4_ = 0;
          local_188.capTable._0_4_ = 0;
          local_188.capTable._4_4_ = 0;
          if (!bVar5) {
            local_188.segment._0_4_ = *(undefined4 *)&(type->_reader).segment;
            local_188.segment._4_4_ = *(undefined4 *)((long)&(type->_reader).segment + 4);
            local_188.capTable._0_4_ = *(undefined4 *)&(type->_reader).capTable;
            local_188.capTable._4_4_ = *(undefined4 *)((long)&(type->_reader).capTable + 4);
          }
          _::PointerReader::getStruct(&local_158,(PointerReader *)&local_188,(word *)0x0);
          bVar5 = (replacement->_reader).pointerCount != 0;
          if (bVar5) {
            pWVar10 = (replacement->_reader).pointers;
            iVar9 = (replacement->_reader).nestingLimit;
          }
          local_128.segment._0_4_ = 0;
          local_128.segment._4_4_ = 0;
          local_128.capTable._0_4_ = 0;
          local_128.capTable._4_4_ = 0;
          if (bVar5) {
            local_128.segment._0_4_ = *(undefined4 *)&(replacement->_reader).segment;
            local_128.segment._4_4_ = *(undefined4 *)((long)&(replacement->_reader).segment + 4);
            local_128.capTable._0_4_ = *(undefined4 *)&(replacement->_reader).capTable;
            local_128.capTable._4_4_ = *(undefined4 *)((long)&(replacement->_reader).capTable + 4);
          }
          local_128.pointer = pWVar10;
          local_128.nestingLimit = iVar9;
          _::PointerReader::getStruct(&local_188,&local_128,(word *)0x0);
          checkCompatibility(this,(Reader *)&local_158,(Reader *)&local_188,ALLOW_UPGRADE_TO_STRUCT)
          ;
          return;
        case 0xf:
          if (uVar3 < 0x80) {
            lVar8 = 0;
          }
          else {
            lVar8 = *(long *)((long)(replacement->_reader).data + 8);
          }
          if (uVar6 < 0x80) {
            lVar7 = 0;
          }
          else {
            lVar7 = *(long *)(psVar4 + 4);
          }
          if (lVar8 == lVar7) {
            return;
          }
          checkCompatibility(this);
          return;
        case 0x10:
          if (uVar3 < 0x80) {
            lVar8 = 0;
          }
          else {
            lVar8 = *(long *)((long)(replacement->_reader).data + 8);
          }
          if (uVar6 < 0x80) {
            lVar7 = 0;
          }
          else {
            lVar7 = *(long *)(psVar4 + 4);
          }
          if (lVar8 == lVar7) {
            return;
          }
          checkCompatibility(this);
          return;
        case 0x11:
          goto switchD_001df87a_caseD_11;
        default:
          return;
        }
      }
    }
    if (*(replacement->_reader).data == 0xd) {
      bVar5 = canUpgradeToData(this,type);
      if (bVar5) goto LAB_001df929;
      uVar6 = (type->_reader).dataSize;
    }
    if (0xf < uVar6) goto LAB_001df949;
  }
  pSVar11 = &(type->_reader).dataSize;
  uVar3 = (replacement->_reader).dataSize;
  if (uVar3 < 0x10) {
    uVar6 = *pSVar11;
LAB_001df9b2:
    bVar5 = true;
    if (0xf < uVar6) goto LAB_001df9b9;
  }
  else {
    uVar6 = *pSVar11;
    if (*(replacement->_reader).data != 0x12) goto LAB_001df9b2;
    if (uVar6 < 0x10) goto LAB_001df9e0;
    uVar2 = *(type->_reader).data;
    if ((0xb < uVar2) && (uVar2 != 0xf)) {
LAB_001df929:
      replacementIsNewer(this);
      return;
    }
LAB_001df9b9:
    bVar5 = false;
    if ((0xf < uVar3) && (*(type->_reader).data == 0x12)) {
      uVar2 = *(replacement->_reader).data;
      bVar5 = false;
      if ((0xb < uVar2) && (bVar5 = false, uVar2 != 0xf)) {
LAB_001df962:
        replacementIsOlder(this);
        return;
      }
    }
  }
  if (upgradeToStructMode != ALLOW_UPGRADE_TO_STRUCT) {
LAB_001df9e0:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[19]>
              ((Fault *)&local_158,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x3c9,FAILED,(char *)0x0,"\"a type was changed\"",
               (char (*) [19])"a type was changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault((Fault *)&local_158);
    return;
  }
  if ((bVar5) || (psVar4 = (short *)(type->_reader).data, *psVar4 != 0x10)) {
    if ((uVar3 < 0x10) || (psVar4 = (short *)(replacement->_reader).data, *psVar4 != 0x10))
    goto LAB_001df9e0;
    if (uVar3 < 0x80) {
      structTypeId = 0;
    }
    else {
      structTypeId = *(uint64_t *)(psVar4 + 4);
    }
    matchSize = &local_d0;
    local_d0.ptr.isSet = false;
    matchPosition = &local_108;
    local_108.ptr.isSet = false;
    replacement = type;
  }
  else {
    if (uVar6 < 0x80) {
      structTypeId = 0;
    }
    else {
      structTypeId = *(uint64_t *)(psVar4 + 4);
    }
    matchSize = &local_60;
    local_60.ptr.isSet = false;
    matchPosition = &local_98;
    local_98.ptr.isSet = false;
  }
  checkUpgradeToStruct(this,replacement,structTypeId,matchSize,matchPosition);
  return;
switchD_001df87a_caseD_11:
  if (uVar3 < 0x80) {
    lVar8 = 0;
  }
  else {
    lVar8 = *(long *)((long)(replacement->_reader).data + 8);
  }
  if (uVar6 < 0x80) {
    lVar7 = 0;
  }
  else {
    lVar7 = *(long *)(psVar4 + 4);
  }
  if (lVar8 == lVar7) {
    return;
  }
  checkCompatibility(this);
  return;
}

Assistant:

void checkCompatibility(const schema::Type::Reader& type,
                          const schema::Type::Reader& replacement,
                          UpgradeToStructMode upgradeToStructMode) {
    if (replacement.which() != type.which()) {
      // Check for allowed "upgrade" to Data or AnyPointer.
      if (replacement.isData() && canUpgradeToData(type)) {
        replacementIsNewer();
        return;
      } else if (type.isData() && canUpgradeToData(replacement)) {
        replacementIsOlder();
        return;
      } else if (replacement.isAnyPointer() && canUpgradeToAnyPointer(type)) {
        replacementIsNewer();
        return;
      } else if (type.isAnyPointer() && canUpgradeToAnyPointer(replacement)) {
        replacementIsOlder();
        return;
      }

      if (upgradeToStructMode == ALLOW_UPGRADE_TO_STRUCT) {
        if (type.isStruct()) {
          checkUpgradeToStruct(replacement, type.getStruct().getTypeId());
          return;
        } else if (replacement.isStruct()) {
          checkUpgradeToStruct(type, replacement.getStruct().getTypeId());
          return;
        }
      }

      FAIL_VALIDATE_SCHEMA("a type was changed");
    }

    switch (type.which()) {
      case schema::Type::VOID:
      case schema::Type::BOOL:
      case schema::Type::INT8:
      case schema::Type::INT16:
      case schema::Type::INT32:
      case schema::Type::INT64:
      case schema::Type::UINT8:
      case schema::Type::UINT16:
      case schema::Type::UINT32:
      case schema::Type::UINT64:
      case schema::Type::FLOAT32:
      case schema::Type::FLOAT64:
      case schema::Type::TEXT:
      case schema::Type::DATA:
      case schema::Type::ANY_POINTER:
        return;

      case schema::Type::LIST:
        checkCompatibility(type.getList().getElementType(), replacement.getList().getElementType(),
                           ALLOW_UPGRADE_TO_STRUCT);
        return;

      case schema::Type::ENUM:
        VALIDATE_SCHEMA(replacement.getEnum().getTypeId() == type.getEnum().getTypeId(),
                        "type changed enum type");
        return;

      case schema::Type::STRUCT:
        // TODO(someday):  If the IDs don't match, we should compare the two structs for
        //   compatibility.  This is tricky, though, because the new type's target may not yet be
        //   loaded.  In that case we could take the old type, make a copy of it, assign the new
        //   ID to the copy, and load() that.  That forces any struct type loaded for that ID to
        //   be compatible.  However, that has another problem, which is that it could be that the
        //   whole reason the type was replaced was to fork that type, and so an incompatibility
        //   could be very much expected.  This could be a rat hole...
        VALIDATE_SCHEMA(replacement.getStruct().getTypeId() == type.getStruct().getTypeId(),
                        "type changed to incompatible struct type");
        return;

      case schema::Type::INTERFACE:
        VALIDATE_SCHEMA(replacement.getInterface().getTypeId() == type.getInterface().getTypeId(),
                        "type changed to incompatible interface type");
        return;
    }

    // We assume unknown types (from newer versions of Cap'n Proto?) are equivalent.
  }